

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

IsMineResult
wallet::anon_unknown_1::IsMineInner
          (LegacyDataSPKM *keystore,CScript *scriptPubKey,IsMineSigVersion sigversion,
          bool recurse_scripthash)

{
  long *plVar1;
  uchar *puVar2;
  pointer n;
  long lVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  TxoutType TVar7;
  int iVar8;
  IsMineResult IVar9;
  uint uVar10;
  IsMineResult IVar11;
  CScript *pCVar12;
  long lVar13;
  long *plVar14;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> vch_01;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  char *local_cc;
  uchar auStack_c4 [8];
  uchar local_bc [4];
  CScript subscript;
  CScriptID scriptID;
  char *local_48;
  uchar auStack_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar7 = Solver(scriptPubKey,&vSolutions);
  auStack_40[8] = '\0';
  auStack_40[9] = '\0';
  auStack_40[10] = '\0';
  auStack_40[0xb] = '\0';
  local_48 = (char *)0x0;
  auStack_40[0] = '\0';
  auStack_40[1] = '\0';
  auStack_40[2] = '\0';
  auStack_40[3] = '\0';
  auStack_40[4] = '\0';
  auStack_40[5] = '\0';
  auStack_40[6] = '\0';
  auStack_40[7] = '\0';
  switch(TVar7) {
  case PUBKEY:
    CPubKey::Set<unsigned_char_const*>
              ((CPubKey *)&subscript,
               ((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    CPubKey::GetID((CKeyID *)&scriptID,(CPubKey *)&subscript);
    auStack_40[8] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
    auStack_40[9] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
    auStack_40[10] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
    auStack_40[0xb] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
    local_48 = (char *)scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                       ._0_8_;
    auStack_40[0] = scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8]
    ;
    auStack_40[1] = scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9]
    ;
    auStack_40[2] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10];
    auStack_40[3] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
    auStack_40[4] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
    auStack_40[5] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
    auStack_40[6] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
    auStack_40[7] =
         scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
    if ((P2SH < sigversion) &&
       ((long)((vSolutions.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)((vSolutions.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 0x21)) goto LAB_001efd9f;
    iVar8 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_48);
    cVar5 = (char)iVar8;
    goto LAB_001efc07;
  case PUBKEYHASH:
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch_01.m_size =
         (long)((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar2;
    vch_01.m_data = puVar2;
    base_blob<160U>::base_blob((base_blob<160U> *)&subscript,vch_01);
    uVar4 = subscript.super_CScriptBase._union._16_8_;
    auStack_40[8] = subscript.super_CScriptBase._union._16_1_;
    auStack_40[9] = subscript.super_CScriptBase._union._17_1_;
    auStack_40[10] = subscript.super_CScriptBase._union._18_1_;
    auStack_40[0xb] = subscript.super_CScriptBase._union._19_1_;
    local_48 = subscript.super_CScriptBase._union.indirect_contents.indirect;
    auStack_40[0] = subscript.super_CScriptBase._union._8_1_;
    auStack_40[1] = subscript.super_CScriptBase._union._9_1_;
    auStack_40[2] = subscript.super_CScriptBase._union._10_1_;
    auStack_40[3] = subscript.super_CScriptBase._union._11_1_;
    auStack_40[4] = subscript.super_CScriptBase._union._12_1_;
    auStack_40[5] = subscript.super_CScriptBase._union._13_1_;
    auStack_40[6] = subscript.super_CScriptBase._union._14_1_;
    auStack_40[7] = subscript.super_CScriptBase._union._15_1_;
    subscript.super_CScriptBase._union._16_8_ = uVar4;
    if (P2SH < sigversion) {
      subscript.super_CScriptBase._union.direct[0] = 0xff;
      iVar8 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1f])(keystore,&local_48);
      if (((char)iVar8 != '\0') && ((subscript.super_CScriptBase._union.direct[0] & 0xfeU) != 2))
      goto LAB_001efd9f;
    }
    iVar8 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_48);
    cVar5 = (char)iVar8;
LAB_001efc07:
    if (cVar5 != '\0') {
LAB_001efc68:
      IVar9 = SPENDABLE;
      goto LAB_001efda2;
    }
    break;
  case SCRIPTHASH:
    if (sigversion != TOP) goto LAB_001efd9f;
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch.m_size = (long)((vSolutions.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar2;
    vch.m_data = puVar2;
    base_blob<160U>::base_blob((base_blob<160U> *)&subscript,vch);
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10] =
         subscript.super_CScriptBase._union._16_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11] =
         subscript.super_CScriptBase._union._17_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12] =
         subscript.super_CScriptBase._union._18_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13] =
         subscript.super_CScriptBase._union._19_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
         subscript.super_CScriptBase._union.indirect_contents.indirect;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8] =
         subscript.super_CScriptBase._union._8_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9] =
         subscript.super_CScriptBase._union._9_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10] =
         subscript.super_CScriptBase._union._10_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb] =
         subscript.super_CScriptBase._union._11_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc] =
         subscript.super_CScriptBase._union._12_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd] =
         subscript.super_CScriptBase._union._13_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe] =
         subscript.super_CScriptBase._union._14_1_;
    scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf] =
         subscript.super_CScriptBase._union._15_1_;
    subscript.super_CScriptBase._union._16_8_ = 0;
    subscript.super_CScriptBase._24_8_ = 0;
    subscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    subscript.super_CScriptBase._union._8_8_ = 0;
    uVar10 = (*(keystore->super_FillableSigningProvider).super_SigningProvider._vptr_SigningProvider
               [2])(&keystore->super_FillableSigningProvider);
    if ((recurse_scripthash & (byte)uVar10) == 1) {
      IVar11 = IsMineInner(keystore,&subscript,P2SH,true);
      goto LAB_001efd33;
    }
LAB_001efd3c:
    IVar9 = (uVar10 & 0xff) * 2;
LAB_001efd41:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&subscript.super_CScriptBase);
    if (IVar9 != NO) goto LAB_001efda2;
    break;
  case MULTISIG:
    if (sigversion == TOP) break;
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,void>
              ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)&subscript,
               vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,
               vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,(allocator_type *)&scriptID);
    if (sigversion != P2SH) {
      lVar13 = (long)(subscript.super_CScriptBase._union._8_8_ -
                     subscript.super_CScriptBase._union._0_8_) / 0x18 + 1;
      plVar14 = (long *)(subscript.super_CScriptBase._union.indirect_contents.indirect + 8);
      do {
        lVar13 = lVar13 + -1;
        if (lVar13 == 0) goto LAB_001efc46;
        lVar3 = *plVar14;
        plVar1 = plVar14 + -1;
        plVar14 = plVar14 + 3;
      } while (lVar3 - *plVar1 == 0x21);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&subscript);
      goto LAB_001efd9f;
    }
LAB_001efc46:
    bVar6 = HaveKeys((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&subscript,keystore);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&subscript);
    if (!bVar6) break;
    goto LAB_001efc68;
  case WITNESS_V0_SCRIPTHASH:
    if (sigversion != WITNESS_V0) {
      if (sigversion == TOP) {
        subscript.super_CScriptBase._union._16_8_ = 0;
        subscript.super_CScriptBase._24_8_ = 0;
        subscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
        subscript.super_CScriptBase._union._8_8_ = 0;
        pCVar12 = CScript::operator<<(&subscript,OP_0);
        pCVar12 = CScript::operator<<(pCVar12,vSolutions.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
        CScriptID::CScriptID(&scriptID,pCVar12);
        iVar8 = (*(keystore->super_FillableSigningProvider).super_SigningProvider.
                  _vptr_SigningProvider[3])(&keystore->super_FillableSigningProvider,&scriptID);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&subscript.super_CScriptBase);
        if ((char)iVar8 == '\0') break;
      }
      n = ((vSolutions.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
      RIPEMD160((uchar *)&subscript,(size_t)n,
                ((vSolutions.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish + -(long)n);
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10] =
           subscript.super_CScriptBase._union._16_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11] =
           subscript.super_CScriptBase._union._17_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12] =
           subscript.super_CScriptBase._union._18_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13] =
           subscript.super_CScriptBase._union._19_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
           subscript.super_CScriptBase._union.indirect_contents.indirect;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8] =
           subscript.super_CScriptBase._union._8_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9] =
           subscript.super_CScriptBase._union._9_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10] =
           subscript.super_CScriptBase._union._10_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb] =
           subscript.super_CScriptBase._union._11_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc] =
           subscript.super_CScriptBase._union._12_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd] =
           subscript.super_CScriptBase._union._13_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe] =
           subscript.super_CScriptBase._union._14_1_;
      scriptID.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf] =
           subscript.super_CScriptBase._union._15_1_;
      subscript.super_CScriptBase._union._16_8_ = 0;
      subscript.super_CScriptBase._24_8_ = 0;
      subscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      subscript.super_CScriptBase._union._8_8_ = 0;
      uVar10 = (*(keystore->super_FillableSigningProvider).super_SigningProvider.
                 _vptr_SigningProvider[2])(&keystore->super_FillableSigningProvider);
      if ((recurse_scripthash & (byte)uVar10) != 1) goto LAB_001efd3c;
      IVar11 = IsMineInner(keystore,&subscript,WITNESS_V0,true);
LAB_001efd33:
      IVar9 = NO;
      if (0 < (int)IVar11) {
        IVar9 = IVar11;
      }
      goto LAB_001efd41;
    }
LAB_001efd9f:
    IVar9 = INVALID;
    goto LAB_001efda2;
  case WITNESS_V0_KEYHASH:
    if (sigversion == WITNESS_V0) goto LAB_001efd9f;
    if (sigversion == TOP) {
      subscript.super_CScriptBase._union._16_8_ = 0;
      subscript.super_CScriptBase._24_8_ = 0;
      subscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      subscript.super_CScriptBase._union._8_8_ = 0;
      pCVar12 = CScript::operator<<(&subscript,OP_0);
      pCVar12 = CScript::operator<<(pCVar12,vSolutions.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
      CScriptID::CScriptID(&scriptID,pCVar12);
      iVar8 = (*(keystore->super_FillableSigningProvider).super_SigningProvider.
                _vptr_SigningProvider[3])(&keystore->super_FillableSigningProvider,&scriptID);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&subscript.super_CScriptBase);
      if ((char)iVar8 == '\0') break;
    }
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch_00.m_size =
         (long)((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar2;
    vch_00.m_data = puVar2;
    base_blob<160U>::base_blob((base_blob<160U> *)&local_cc,vch_00);
    subscript.super_CScriptBase._union._16_1_ = local_bc[0];
    subscript.super_CScriptBase._union._17_1_ = local_bc[1];
    subscript.super_CScriptBase._union._18_1_ = local_bc[2];
    subscript.super_CScriptBase._union._19_1_ = local_bc[3];
    subscript.super_CScriptBase._union.indirect_contents.indirect = local_cc;
    subscript.super_CScriptBase._union._8_1_ = auStack_c4[0];
    subscript.super_CScriptBase._union._9_1_ = auStack_c4[1];
    subscript.super_CScriptBase._union._10_1_ = auStack_c4[2];
    subscript.super_CScriptBase._union._11_1_ = auStack_c4[3];
    subscript.super_CScriptBase._union._12_1_ = auStack_c4[4];
    subscript.super_CScriptBase._union._13_1_ = auStack_c4[5];
    subscript.super_CScriptBase._union._14_1_ = auStack_c4[6];
    subscript.super_CScriptBase._union._15_1_ = auStack_c4[7];
    GetScriptForDestination((CScript *)&scriptID,(CTxDestination *)&subscript);
    IVar9 = IsMineInner(keystore,(CScript *)&scriptID,WITNESS_V0,true);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&scriptID);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&subscript);
    if (0 < (int)IVar9) goto LAB_001efda2;
  }
  bVar6 = LegacyDataSPKM::HaveWatchOnly(keystore,scriptPubKey);
  IVar9 = (IsMineResult)bVar6;
LAB_001efda2:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&vSolutions);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return IVar9;
  }
  __stack_chk_fail();
}

Assistant:

IsMineResult IsMineInner(const LegacyDataSPKM& keystore, const CScript& scriptPubKey, IsMineSigVersion sigversion, bool recurse_scripthash=true)
{
    IsMineResult ret = IsMineResult::NO;

    std::vector<valtype> vSolutions;
    TxoutType whichType = Solver(scriptPubKey, vSolutions);

    CKeyID keyID;
    switch (whichType) {
    case TxoutType::NONSTANDARD:
    case TxoutType::NULL_DATA:
    case TxoutType::WITNESS_UNKNOWN:
    case TxoutType::WITNESS_V1_TAPROOT:
    case TxoutType::ANCHOR:
        break;
    case TxoutType::PUBKEY:
        keyID = CPubKey(vSolutions[0]).GetID();
        if (!PermitsUncompressed(sigversion) && vSolutions[0].size() != 33) {
            return IsMineResult::INVALID;
        }
        if (keystore.HaveKey(keyID)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    case TxoutType::WITNESS_V0_KEYHASH:
    {
        if (sigversion == IsMineSigVersion::WITNESS_V0) {
            // P2WPKH inside P2WSH is invalid.
            return IsMineResult::INVALID;
        }
        if (sigversion == IsMineSigVersion::TOP && !keystore.HaveCScript(CScriptID(CScript() << OP_0 << vSolutions[0]))) {
            // We do not support bare witness outputs unless the P2SH version of it would be
            // acceptable as well. This protects against matching before segwit activates.
            // This also applies to the P2WSH case.
            break;
        }
        ret = std::max(ret, IsMineInner(keystore, GetScriptForDestination(PKHash(uint160(vSolutions[0]))), IsMineSigVersion::WITNESS_V0));
        break;
    }
    case TxoutType::PUBKEYHASH:
        keyID = CKeyID(uint160(vSolutions[0]));
        if (!PermitsUncompressed(sigversion)) {
            CPubKey pubkey;
            if (keystore.GetPubKey(keyID, pubkey) && !pubkey.IsCompressed()) {
                return IsMineResult::INVALID;
            }
        }
        if (keystore.HaveKey(keyID)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    case TxoutType::SCRIPTHASH:
    {
        if (sigversion != IsMineSigVersion::TOP) {
            // P2SH inside P2WSH or P2SH is invalid.
            return IsMineResult::INVALID;
        }
        CScriptID scriptID = CScriptID(uint160(vSolutions[0]));
        CScript subscript;
        if (keystore.GetCScript(scriptID, subscript)) {
            ret = std::max(ret, recurse_scripthash ? IsMineInner(keystore, subscript, IsMineSigVersion::P2SH) : IsMineResult::SPENDABLE);
        }
        break;
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH:
    {
        if (sigversion == IsMineSigVersion::WITNESS_V0) {
            // P2WSH inside P2WSH is invalid.
            return IsMineResult::INVALID;
        }
        if (sigversion == IsMineSigVersion::TOP && !keystore.HaveCScript(CScriptID(CScript() << OP_0 << vSolutions[0]))) {
            break;
        }
        CScriptID scriptID{RIPEMD160(vSolutions[0])};
        CScript subscript;
        if (keystore.GetCScript(scriptID, subscript)) {
            ret = std::max(ret, recurse_scripthash ? IsMineInner(keystore, subscript, IsMineSigVersion::WITNESS_V0) : IsMineResult::SPENDABLE);
        }
        break;
    }

    case TxoutType::MULTISIG:
    {
        // Never treat bare multisig outputs as ours (they can still be made watchonly-though)
        if (sigversion == IsMineSigVersion::TOP) {
            break;
        }

        // Only consider transactions "mine" if we own ALL the
        // keys involved. Multi-signature transactions that are
        // partially owned (somebody else has a key that can spend
        // them) enable spend-out-from-under-you attacks, especially
        // in shared-wallet situations.
        std::vector<valtype> keys(vSolutions.begin()+1, vSolutions.begin()+vSolutions.size()-1);
        if (!PermitsUncompressed(sigversion)) {
            for (size_t i = 0; i < keys.size(); i++) {
                if (keys[i].size() != 33) {
                    return IsMineResult::INVALID;
                }
            }
        }
        if (HaveKeys(keys, keystore)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    }
    } // no default case, so the compiler can warn about missing cases

    if (ret == IsMineResult::NO && keystore.HaveWatchOnly(scriptPubKey)) {
        ret = std::max(ret, IsMineResult::WATCH_ONLY);
    }
    return ret;
}